

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseInstrList(WastParser *this,ExprList *exprs)

{
  bool bVar1;
  Result RVar2;
  TokenTypePair pair_00;
  __off64_t *in_R8;
  size_t in_R9;
  iterator iVar3;
  ExprList *in_stack_ffffffffffffff58;
  Expr *local_80;
  Expr *local_58;
  TokenTypePair pair;
  ExprList new_exprs;
  ExprList *exprs_local;
  WastParser *this_local;
  
  intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)&pair);
  do {
    while( true ) {
      pair_00 = PeekPair(this);
      bVar1 = anon_unknown_1::IsInstr(pair_00);
      if (!bVar1) break;
      RVar2 = ParseInstr(this,(ExprList *)&pair);
      bVar1 = Succeeded(RVar2);
      if (bVar1) {
        iVar3 = intrusive_list<wabt::Expr>::end(exprs);
        local_58 = iVar3.node_;
        intrusive_list<wabt::Expr>::splice
                  (exprs,(int)iVar3.list_,(__off64_t *)local_58,(int)&pair,in_R8,in_R9,
                   (uint)in_stack_ffffffffffffff58);
      }
      else {
        RVar2 = Synchronize(this,anon_unknown_1::IsInstr);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
LAB_00222fec:
          intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)&pair);
          return (Result)this_local._4_4_;
        }
      }
    }
    bVar1 = anon_unknown_1::IsLparAnn(pair_00);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      goto LAB_00222fec;
    }
    RVar2 = ParseCodeMetadataAnnotation(this,(ExprList *)&pair);
    bVar1 = Succeeded(RVar2);
    if (bVar1) {
      in_stack_ffffffffffffff58 = exprs;
      iVar3 = intrusive_list<wabt::Expr>::end(exprs);
      local_80 = iVar3.node_;
      intrusive_list<wabt::Expr>::splice
                (in_stack_ffffffffffffff58,(int)iVar3.list_,(__off64_t *)local_80,(int)&pair,in_R8,
                 in_R9,(uint)in_stack_ffffffffffffff58);
    }
    else {
      RVar2 = Synchronize(this,anon_unknown_1::IsLparAnn);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_00222fec;
      }
    }
  } while( true );
}

Assistant:

Result WastParser::ParseInstrList(ExprList* exprs) {
  WABT_TRACE(ParseInstrList);
  ExprList new_exprs;
  while (true) {
    auto pair = PeekPair();
    if (IsInstr(pair)) {
      if (Succeeded(ParseInstr(&new_exprs))) {
        exprs->splice(exprs->end(), new_exprs);
      } else {
        CHECK_RESULT(Synchronize(IsInstr));
      }
    } else if (IsLparAnn(pair)) {
      if (Succeeded(ParseCodeMetadataAnnotation(&new_exprs))) {
        exprs->splice(exprs->end(), new_exprs);
      } else {
        CHECK_RESULT(Synchronize(IsLparAnn));
      }
    } else {
      break;
    }
  }
  return Result::Ok;
}